

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

tuple<pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code> *
__thiscall
pstore::json::details::string_matcher<json_out_callbacks>::consume_normal_state
          (tuple<pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
           *__return_storage_ptr__,string_matcher<json_out_callbacks> *this,
          parser<json_out_callbacks> *parser,char32_t code_point,appender *app)

{
  char cVar1;
  state sVar2;
  int iVar3;
  error_category *peVar4;
  state sVar5;
  error_code eVar6;
  
  peVar4 = (error_category *)std::_V2::system_category();
  if (code_point == L'\\') {
    sVar2 = escape_state;
LAB_001383b7:
    sVar5 = sVar2;
    iVar3 = 0;
  }
  else {
    if (code_point == L'\"') {
      if (app->high_surrogate_ == L'\0') {
        cVar1 = (this->super_matcher<json_out_callbacks>).field_0xc;
        eVar6 = json_out_callbacks::string_value(&parser->callbacks_,(app->result_).ptr_);
        sVar5 = done_state;
        sVar2 = done_state;
        if (cVar1 == '\0') {
          iVar3 = eVar6._M_value;
          peVar4 = eVar6._M_cat;
          goto LAB_001383dc;
        }
        goto LAB_001383b7;
      }
      sVar5 = done_state;
    }
    else {
      if ((0x1f < (uint)code_point) && (app->high_surrogate_ == L'\0')) {
        utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>
                  (code_point,(app->result_).ptr_);
        sVar2 = normal_char_state;
        goto LAB_001383b7;
      }
      sVar5 = normal_char_state;
    }
    iVar3 = 0xd;
    peVar4 = get_error_category();
  }
LAB_001383dc:
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
  ).super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
  _M_head_impl._M_value = iVar3;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
  ).super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
  _M_head_impl._M_cat = peVar4;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_std::error_code>
  ).super__Head_base<0UL,_pstore::json::details::string_matcher<json_out_callbacks>::state,_false>.
  _M_head_impl = sVar5;
  return __return_storage_ptr__;
}

Assistant:

auto string_matcher<Callbacks>::consume_normal_state (parser<Callbacks> & parser,
                                                                  char32_t code_point,
                                                                  appender & app)
                -> std::tuple<state, std::error_code> {
                state next_state = normal_char_state;
                std::error_code error;

                if (code_point == '"') {
                    if (app.has_high_surrogate ()) {
                        error = error_code::bad_unicode_code_point;
                    } else {
                        // Consume the closing quote character.
                        if (object_key_) {
                            error = parser.callbacks ().key (*app.result ());
                        } else {
                            error = parser.callbacks ().string_value (*app.result ());
                        }
                    }
                    next_state = done_state;
                } else if (code_point == '\\') {
                    next_state = escape_state;
                } else if (code_point <= 0x1F) {
                    // Control characters U+0000 through U+001F MUST be escaped.
                    error = error_code::bad_unicode_code_point;
                } else {
                    if (!app.append32 (code_point)) {
                        error = error_code::bad_unicode_code_point;
                    }
                }

                return std::make_tuple (next_state, error);
            }